

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::
visit_string(basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
            string_view_type *sv,semantic_tag tag,ser_context *context,error_code *ec)

{
  size_t *psVar1;
  pointer psVar2;
  undefined7 in_register_00000011;
  uint8_t ch;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_40;
  
  switch((int)CONCAT71(in_register_00000011,tag)) {
  case 2:
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&local_40,sv->_M_str,sv->_M_len)
    ;
    write_bignum(this,&local_40);
    psVar2 = (this->stack_).
             super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->stack_).
        super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
        ._M_impl.super__Vector_impl_data._M_start != psVar2) {
      psVar1 = &psVar2[-1].index_;
      *psVar1 = *psVar1 + 1;
    }
    if ((local_40.field_0._0_1_ & 1) == 0) {
      return true;
    }
    if ((pointer)local_40.field_0.short_stor_.values_[1] == (pointer)0x0) {
      return true;
    }
    operator_delete(local_40.field_0.dynamic_stor_.data_,
                    local_40.field_0.short_stor_.values_[0] << 3);
    return true;
  case 3:
    write_decimal_value(this,sv,context,ec);
    return true;
  case 4:
    ch = 0xc0;
    break;
  default:
    goto switchD_0029111f_caseD_5;
  case 9:
    binary_stream_sink::push_back(&this->sink_,0xd8);
    ch = '\"';
    break;
  case 10:
    write_hexfloat_value(this,sv,context,ec);
    return true;
  case 0xc:
    binary_stream_sink::push_back(&this->sink_,0xd8);
    ch = '!';
    break;
  case 0xe:
    binary_stream_sink::push_back(&this->sink_,0xd8);
    ch = ' ';
  }
  binary_stream_sink::push_back(&this->sink_,ch);
switchD_0029111f_caseD_5:
  write_string(this,sv);
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start != psVar2) {
    psVar1 = &psVar2[-1].index_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context& context, std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::bigint:
            {
                bigint n = bigint::from_string(sv.data(), sv.length());
                write_bignum(n);
                end_value();
                break;
            }
            case semantic_tag::bigdec:
            {
                write_decimal_value(sv, context, ec);
                break;
            }
            case semantic_tag::bigfloat:
            {
                write_hexfloat_value(sv, context, ec);
                break;
            }
            case semantic_tag::datetime:
            {
                write_tag(0);

                write_string(sv);
                end_value();
                break;
            }
            case semantic_tag::uri:
            {
                write_tag(32);
                write_string(sv);
                end_value();
                break;
            }
            case semantic_tag::base64url:
            {
                write_tag(33);
                write_string(sv);
                end_value();
                break;
            }
            case semantic_tag::base64:
            {
                write_tag(34);
                write_string(sv);
                end_value();
                break;
            }
            default:
            {
                write_string(sv);
                end_value();
                break;
            }
        }
        JSONCONS_VISITOR_RETURN;
    }